

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O0

void __thiscall
CP::
priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:30:11)>
::pop(priority_queue<Song,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_noppakorn[P]2110211_grader_d58_q2_custom_song_h:30:11)>
      *this)

{
  size_t sVar1;
  out_of_range *this_00;
  priority_queue<Song,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_noppakorn[P]2110211_grader_d58_q2_custom_song_h:30:11)>
  *this_local;
  
  sVar1 = size(this);
  if (sVar1 == 0) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"index of out range");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  Song::operator=(this->mData,this->mData + (this->mSize - 1));
  this->mSize = this->mSize - 1;
  fixDown(this,0);
  return;
}

Assistant:

void pop() {
      if (size() == 0) throw std::out_of_range("index of out range");
      mData[0] = mData[mSize-1];
      mSize--;
      fixDown(0);
    }